

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O2

void __thiscall
JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::flush
          (JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *this)

{
  ulong uVar1;
  
  if (this->is_flushed_ == false) {
    this->is_flushed_ = true;
    this->did_flush_ = true;
    uVar1 = (this->time_since_update_).super_WrappedInt<HalfCycles>.length_;
    (this->time_since_update_).super_WrappedInt<HalfCycles>.length_ = (long)uVar1 % 0x28cc55;
    if (0x28cc54 < (long)uVar1) {
      Motorola::MFP68901::MFP68901::run_for(&this->object_,(HalfCycles)(uVar1 / 0x28cc55));
      return;
    }
  }
  return;
}

Assistant:

forceinline void flush() {
			if(!is_flushed_) {
				did_flush_ = is_flushed_ = true;
				if constexpr (divider == 1) {
					const auto duration = time_since_update_.template flush<TargetTimeScale>();
					object_.run_for(duration);
				} else {
					const auto duration = time_since_update_.template divide<TargetTimeScale>(LocalTimeScale(divider));
					if(duration > TargetTimeScale(0))
						object_.run_for(duration);
				}
			}
		}